

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O0

If_LibLut_t * If_LibLutReadString(char *pStr)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  char *__ptr;
  char *pcVar4;
  double dVar5;
  int local_54;
  uint local_50;
  int j;
  int k;
  int i;
  char *pStrMem;
  char *pStrNew;
  char *pBuffer;
  char *pToken;
  Vec_Ptr_t *vStrs;
  If_LibLut_t *p;
  char *pStr_local;
  
  if ((pStr == (char *)0x0) || (*pStr == '\0')) {
    pStr_local = (char *)0x0;
  }
  else {
    p_00 = Vec_PtrAlloc(1000);
    __ptr = Abc_UtilStrsav(pStr);
    pStrMem = __ptr;
    while (*pStrMem != '\0') {
      Vec_PtrPush(p_00,pStrMem);
      for (; *pStrMem != '\n'; pStrMem = pStrMem + 1) {
      }
      while (*pStrMem == '\n') {
        *pStrMem = '\0';
        pStrMem = pStrMem + 1;
      }
    }
    pStr_local = (char *)malloc(0x1198);
    memset(pStr_local,0,0x1198);
    j = 1;
    for (local_54 = 0; iVar3 = Vec_PtrSize(p_00), local_54 < iVar3; local_54 = local_54 + 1) {
      pcVar4 = (char *)Vec_PtrEntry(p_00,local_54);
      if (((*pcVar4 != '\0') && (pcVar4 = strtok(pcVar4," \t\n"), pcVar4 != (char *)0x0)) &&
         (*pcVar4 != '#')) {
        iVar3 = atoi(pcVar4);
        if (j != iVar3) {
          Abc_Print(1,"Error in the LUT library string.\n");
          if (*(long *)pStr_local != 0) {
            free(*(void **)pStr_local);
            *(long *)pStr_local = 0;
          }
          if ((long *)pStr_local != (long *)0x0) {
            free(pStr_local);
          }
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          Vec_PtrFree(p_00);
          return (If_LibLut_t *)0x0;
        }
        pcVar4 = strtok((char *)0x0," \t\n");
        dVar5 = atof(pcVar4);
        *(float *)((long)pStr_local + (long)j * 4 + 0x10) = (float)dVar5;
        local_50 = 0;
        while (pcVar4 = strtok((char *)0x0," \t\n"), pcVar4 != (char *)0x0) {
          dVar5 = atof(pcVar4);
          *(float *)((long)pStr_local + (long)(int)local_50 * 4 + (long)j * 0x84 + 0x94) =
               (float)dVar5;
          local_50 = local_50 + 1;
        }
        if (j < (int)local_50) {
          Abc_Print(1,"LUT %d has too many pins (%d). Max allowed is %d.\n",(ulong)(uint)j,
                    (ulong)local_50,(ulong)(uint)j);
          if (*(long *)pStr_local != 0) {
            free(*(void **)pStr_local);
            *(long *)pStr_local = 0;
          }
          if ((long *)pStr_local != (long *)0x0) {
            free(pStr_local);
          }
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          Vec_PtrFree(p_00);
          return (If_LibLut_t *)0x0;
        }
        if (1 < (int)local_50) {
          *(undefined4 *)((long)pStr_local + 0xc) = 1;
        }
        if (j == 0x20) {
          Abc_Print(1,"Skipping LUTs of size more than %d.\n",0x20);
          if (*(long *)pStr_local != 0) {
            free(*(void **)pStr_local);
            *(long *)pStr_local = 0;
          }
          if ((long *)pStr_local != (long *)0x0) {
            free(pStr_local);
          }
          if (__ptr != (char *)0x0) {
            free(__ptr);
          }
          Vec_PtrFree(p_00);
          return (If_LibLut_t *)0x0;
        }
        j = j + 1;
      }
    }
    *(int *)((long)pStr_local + 8) = j + -1;
    if (*(int *)((long)pStr_local + 0xc) == 0) {
      for (j = 1; j <= (int)*(long *)((long)pStr_local + 8); j = j + 1) {
        if (*(float *)((long)pStr_local + (long)j * 0x84 + 0x94) <= 0.0) {
          Abc_Print(0,
                    "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                    ,(double)*(float *)((long)pStr_local + (long)j * 0x84 + 0x94),(ulong)(uint)j);
        }
      }
    }
    else {
      for (j = 1; j <= (int)*(long *)((long)pStr_local + 8); j = j + 1) {
        for (local_50 = 0; (int)local_50 < j; local_50 = local_50 + 1) {
          if (*(float *)((long)pStr_local + (long)(int)local_50 * 4 + (long)j * 0x84 + 0x94) <= 0.0)
          {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n"
                      ,(double)*(float *)((long)pStr_local +
                                         (long)(int)local_50 * 4 + (long)j * 0x84 + 0x94),
                      (ulong)local_50,(ulong)(uint)j);
          }
          if ((local_50 != 0) &&
             (fVar2 = *(float *)((long)pStr_local +
                                (long)(int)(local_50 - 1) * 4 + (long)j * 0x84 + 0x94),
             pfVar1 = (float *)((long)pStr_local + (long)(int)local_50 * 4 + (long)j * 0x84 + 0x94),
             *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
            Abc_Print(0,
                      "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n"
                      ,(double)*(float *)((long)pStr_local +
                                         (long)(int)(local_50 - 1) * 4 + (long)j * 0x84 + 0x94),
                      (double)*(float *)((long)pStr_local +
                                        (long)(int)local_50 * 4 + (long)j * 0x84 + 0x94),
                      (ulong)(local_50 - 1),(ulong)(uint)j,(ulong)local_50,(ulong)(uint)j);
          }
        }
      }
    }
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
    Vec_PtrFree(p_00);
  }
  return (If_LibLut_t *)pStr_local;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reads the description of LUTs from the LUT library file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
If_LibLut_t * If_LibLutReadString( char * pStr )
{
    If_LibLut_t * p;
    Vec_Ptr_t * vStrs;
    char * pToken, * pBuffer, * pStrNew, * pStrMem;
    int i, k, j;

    if ( pStr == NULL || pStr[0] == 0 )
        return NULL;

    vStrs = Vec_PtrAlloc( 1000 );
    pStrNew = pStrMem = Abc_UtilStrsav( pStr );
    while ( *pStrNew )
    {
        Vec_PtrPush( vStrs, pStrNew );
        while ( *pStrNew != '\n' )
            pStrNew++;
        while ( *pStrNew == '\n' )
            *pStrNew++ = '\0';
    }

    p = ABC_ALLOC( If_LibLut_t, 1 );
    memset( p, 0, sizeof(If_LibLut_t) );

    i = 1;
    //while ( fgets( pBuffer, 1000, pFile ) != NULL )
    Vec_PtrForEachEntry( char *, vStrs, pBuffer, j )
    {
        if ( pBuffer[0] == 0 )
            continue;
        pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        if ( i != atoi(pToken) )
        {
            Abc_Print( 1, "Error in the LUT library string.\n" );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // read area
        pToken = strtok( NULL, " \t\n" );
        p->pLutAreas[i] = (float)atof(pToken);

        // read delays
        k = 0;
        while ( (pToken = strtok( NULL, " \t\n" )) )
            p->pLutDelays[i][k++] = (float)atof(pToken);

        // check for out-of-bound
        if ( k > i )
        {
            Abc_Print( 1, "LUT %d has too many pins (%d). Max allowed is %d.\n", i, k, i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }

        // check if var delays are specified
        if ( k > 1 )
            p->fVarPinDelays = 1;

        if ( i == IF_MAX_LUTSIZE )
        {
            Abc_Print( 1, "Skipping LUTs of size more than %d.\n", i );
            ABC_FREE( p->pName );
            ABC_FREE( p );
            ABC_FREE( pStrMem );
            Vec_PtrFree( vStrs );
            return NULL;
        }
        i++;
    }
    p->LutMax = i-1;

    // check the library
    if ( p->fVarPinDelays )
    {
        for ( i = 1; i <= p->LutMax; i++ )
            for ( k = 0; k < i; k++ )
            {
                if ( p->pLutDelays[i][k] <= 0.0 )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                        k, i, p->pLutDelays[i][k] );
                if ( k && p->pLutDelays[i][k-1] > p->pLutDelays[i][k] )
                    Abc_Print( 0, "Pin %d of LUT %d has delay %f. Pin %d of LUT %d has delay %f. Pin delays should be in non-decreasing order. Technology mapping may not work correctly.\n", 
                        k-1, i, p->pLutDelays[i][k-1], 
                        k, i, p->pLutDelays[i][k] );
            }
    }
    else
    {
        for ( i = 1; i <= p->LutMax; i++ )
        {
            if ( p->pLutDelays[i][0] <= 0.0 )
                Abc_Print( 0, "LUT %d has delay %f. Pin delays should be non-negative numbers. Technology mapping may not work correctly.\n", 
                    i, p->pLutDelays[i][0] );
        }
    }

    // cleanup
    ABC_FREE( pStrMem );
    Vec_PtrFree( vStrs );
    return p;
}